

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamGenerator<unsigned_int> __thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 in_RSI;
  ParamGenerator<unsigned_int> PVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  ValueArray<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int> *this_local;
  
  this_local = (ValueArray<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int> *)this;
  ValueArray<unsigned_int,unsigned_int,unsigned_int,unsigned_int>::
  MakeVector<unsigned_int,0ul,1ul,2ul,3ul>(&local_30,in_RSI);
  ValuesIn<std::vector<unsigned_int,std::allocator<unsigned_int>>>((testing *)this,&local_30);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_30);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<unsigned_int>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }